

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::RegExprDFAParseHandler::Reduce
          (RegExprDFAParseHandler *this,Parse<SGParser::Generator::RegExprDFAParseElement> *parse,
          uint productionID)

{
  RegExprDataType RVar1;
  pointer puVar2;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 aVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
  *this_00;
  long lVar4;
  undefined8 this_01;
  undefined4 uVar5;
  pointer puVar6;
  RegExprDFAParseElement *pRVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar8;
  RegExprDFANode *pRVar9;
  const_iterator cVar10;
  iterator iVar11;
  _Base_ptr p_Var12;
  uint *ord;
  ulong uVar13;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 *paVar14;
  bool bVar15;
  uint uVar16;
  IndexType index;
  IndexType IStack_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 local_80;
  string names;
  anon_union_8_3_5244310a_for_RegExprDFAParseElement_3 aStack_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList;
  
  bVar15 = true;
  switch(productionID) {
  case 1:
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    pRVar9->Type = And;
    pRVar9->ID = 0;
    pRVar9->Position = 0;
    (pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar9->pParent = (RegExprDFANode *)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::Add(pRVar9,(pRVar7->field_1).pNode);
    IStack_d0 = 1;
    goto LAB_0013864d;
  case 2:
  case 4:
  case 8:
    break;
  case 3:
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    pRVar9->Type = Or;
    pRVar9->ID = 0;
    pRVar9->Position = 0;
    (pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar9->pParent = (RegExprDFANode *)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::Add(pRVar9,(pRVar7->field_1).pNode);
    IStack_d0 = 2;
    goto LAB_0013864d;
  case 5:
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    pRVar9->Type = Star;
    pRVar9->ID = 0;
    goto LAB_00138574;
  case 6:
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    pRVar9->Type = Plus;
    pRVar9->ID = 0;
    goto LAB_00138574;
  case 7:
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    pRVar9->Type = Question;
    pRVar9->ID = 0;
LAB_00138574:
    pRVar9->Position = 0;
    (pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&(pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish + 5) = 0;
    *(undefined8 *)
     ((long)&(pRVar9->Chars).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage + 5) = 0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->FirstPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->LastPos).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar9->pParent = (RegExprDFANode *)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pRVar9->Children).
    super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    IStack_d0 = 0;
LAB_0013864d:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,IStack_d0);
    RegExprDFANode::Add(pRVar9,(pRVar7->field_1).pNode);
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pNode = pRVar9;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Node;
    break;
  case 9:
    index = 1;
    goto LAB_001386dd;
  case 10:
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    uVar16 = this->PositionCount;
    this->PositionCount = uVar16 + 1;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    RegExprDFANode::RegExprDFANode(pRVar9,Char,uVar16,(pRVar7->field_1).ch);
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pNode = pRVar9;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Node;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::push_back(&this->Nodes,(value_type *)&(pRVar7->field_1).pChars);
    break;
  case 0xb:
    aStack_58.pChars = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,0xfd);
    uVar5 = 1;
    while( true ) {
      local_80.ch = uVar5;
      if (0xff < (uint)uVar5) break;
      if (((char)uVar5 != '\n') && ((uVar5 & 0xff) != 0xd)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,&local_80.ch);
        uVar5 = local_80.ch;
      }
      uVar5 = uVar5 + 1;
    }
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    uVar16 = this->PositionCount;
    this->PositionCount = uVar16 + 1;
    RegExprDFANode::RegExprDFANode
              (pRVar9,Char,uVar16,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58)
    ;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pNode = pRVar9;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Node;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::push_back(&this->Nodes,(value_type *)&(pRVar7->field_1).pChars);
    goto LAB_00138ac7;
  case 0xc:
    names.field_2._8_8_ = parse;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    pvVar8 = (pRVar7->field_1).pChars;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    aStack_58.pChars = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    puVar6 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar13 = 0; this_01 = names.field_2._8_8_,
        uVar13 < (ulong)((long)(pvVar8->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2);
        uVar13 = uVar13 + 2) {
      uVar16 = puVar6[uVar13];
      while( true ) {
        local_80.ch = uVar16;
        if (puVar6[uVar13 | 1] < uVar16) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,&local_80.ch);
        uVar16 = local_80.ch + 1;
        puVar6 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)names.field_2._8_8_,1)
    ;
    RegExprDFAParseElement::Destroy(pRVar7);
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    uVar16 = this->PositionCount;
    this->PositionCount = uVar16 + 1;
    RegExprDFANode::RegExprDFANode
              (pRVar9,Char,uVar16,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58)
    ;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)this_01,0);
    (pRVar7->field_1).pNode = pRVar9;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)this_01,0);
    pRVar7->DataType = Node;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprDFAParseElement> *)this_01,0);
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::push_back(&this->Nodes,(value_type *)&(pRVar7->field_1).pChars);
    goto LAB_00138ac7;
  case 0xd:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    pvVar8 = (pRVar7->field_1).pChars;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    aStack_58.pChars = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar5 = 1;
    while( true ) {
      local_80.ch = uVar5;
      if (0xff < (uint)uVar5) break;
      puVar6 = (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar15 = false;
      for (uVar13 = 0;
          uVar13 < (ulong)((long)(pvVar8->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2);
          uVar13 = uVar13 + 2) {
        for (uVar16 = puVar6[uVar13]; uVar16 <= puVar6[uVar13 + 1]; uVar16 = uVar16 + 1) {
          bVar15 = (bool)(bVar15 | uVar5 == uVar16);
        }
      }
      if (!bVar15) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,&local_80.ch);
        uVar5 = local_80.ch;
      }
      uVar5 = uVar5 + 1;
    }
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    RegExprDFAParseElement::Destroy(pRVar7);
    pRVar9 = (RegExprDFANode *)operator_new(0x80);
    uVar16 = this->PositionCount;
    this->PositionCount = uVar16 + 1;
    RegExprDFANode::RegExprDFANode
              (pRVar9,Char,uVar16,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58)
    ;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pNode = pRVar9;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Node;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    std::
    vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
    ::push_back(&this->Nodes,(value_type *)&(pRVar7->field_1).pChars);
LAB_00138ac7:
    bVar15 = true;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58);
    break;
  case 0xe:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    if ((pRVar7->field_1).pChars == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("parse[1].pChars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x2f1,
                    "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                   );
    }
    aStack_58.pChars =
         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
         &charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    std::__cxx11::string::reserve((ulong)&aStack_58);
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    puVar2 = (((pRVar7->field_1).pChars)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar6 = (((pRVar7->field_1).pChars)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1) {
      std::__cxx11::string::push_back((char)&aStack_58);
    }
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    RegExprDFAParseElement::Destroy(pRVar7);
    this_00 = &this->pMacroSyntaxTrees->_M_t;
    if (this_00 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
         *)0x0) {
      __assert_fail("pMacroSyntaxTrees != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x2fc,
                    "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                   );
    }
    cVar10 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::DFASyntaxTree<SGParser::Generator::RegExprDFANode>_*>_>_>
             ::find(this_00,(key_type *)&aStack_58);
    if ((_Rb_tree_header *)cVar10._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
      local_80.pChars =
           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&names._M_string_length;
      names._M_dataplus._M_p = (pointer)0x0;
      names._M_string_length._0_1_ = 0;
      names.field_2._8_8_ = this_00;
      for (p_Var12 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
          p_Var12 != cVar10._M_node; p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        std::operator+(&local_a0," \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var12 + 1));
        std::operator+(&local_c0,&local_a0,'\'');
        std::__cxx11::string::append((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      Lex::CheckForErrorAndReport
                (this->pLex,"Macro \'%s\' not defined; there are %zu known macros:%s",
                 aStack_58.pChars,*(undefined8 *)(names.field_2._8_8_ + 0x28),local_80.pChars);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      if (this->pLex == (Lex *)0x0) {
        __assert_fail("pLex != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30a,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)this->pLex,(key_type *)&aStack_58);
      if ((_Rb_tree_header *)iVar11._M_node ==
          &(this->pLex->Macros)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("pLex->Macros.find(macroName) != pLex->Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30b,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      lVar4 = *(long *)(cVar10._M_node + 2);
      if (lVar4 == 0) {
        __assert_fail("iter->second",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x30e,
                      "virtual bool SGParser::Generator::RegExprDFAParseHandler::Reduce(Parse<RegExprDFAParseElement> &, unsigned int)"
                     );
      }
      pvVar8 = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(lVar4 + 8);
      if (pvVar8 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
        (pRVar7->field_1).pChars = pvVar8;
        pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
        pRVar7->DataType = Node;
        std::
        vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
        ::
        insert<__gnu_cxx::__normal_iterator<SGParser::Generator::RegExprDFANode**,std::vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>>,void>
                  ((vector<SGParser::Generator::RegExprDFANode*,std::allocator<SGParser::Generator::RegExprDFANode*>>
                    *)&this->Nodes,
                   (const_iterator)
                   (this->Nodes).
                   super__Vector_base<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<SGParser::Generator::RegExprDFANode_**,_std::vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>_>
                    )*(RegExprDFANode ***)(lVar4 + 0x10),
                   (__normal_iterator<SGParser::Generator::RegExprDFANode_**,_std::vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>_>
                    )*(RegExprDFANode ***)(lVar4 + 0x18));
        *(undefined8 *)(lVar4 + 8) = 0;
        std::__cxx11::string::~string((string *)&aStack_58);
        return true;
      }
      Lex::CheckForErrorAndReport
                (this->pLex,"Invalid regular expression in macro \'%s\' used",aStack_58.pChars);
    }
    std::__cxx11::string::~string((string *)&aStack_58);
    bVar15 = false;
    break;
  case 0xf:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    aStack_58.ch = (pRVar7->field_1).ch;
    pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pChars = pvVar8;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Chars;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((pRVar7->field_1).pChars,&aStack_58.ch);
    goto LAB_001387d7;
  case 0x10:
    index = 1;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    pvVar8 = (pRVar7->field_1).pChars;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    paVar14 = &pRVar7->field_1;
    goto LAB_001386d8;
  case 0x11:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    aStack_58.ch = (pRVar7->field_1).ch;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    paVar14 = &local_80;
    local_80.ch = (pRVar7->field_1).ch;
    pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pChars = pvVar8;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Chars;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((pRVar7->field_1).pChars,&aStack_58.ch);
    goto LAB_0013887f;
  case 0x12:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    aStack_58.ch = (pRVar7->field_1).ch;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,2);
    paVar14 = &local_80;
    local_80.ch = (pRVar7->field_1).ch;
    index = 3;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((pRVar7->field_1).pChars,&aStack_58.ch);
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,3);
    pvVar8 = (pRVar7->field_1).pChars;
LAB_001386d8:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar8,&paVar14->ch);
LAB_001386dd:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,index);
    aVar3 = pRVar7->field_1;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->field_1 = aVar3;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,index);
    RVar1 = pRVar7->DataType;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = RVar1;
    break;
  case 0x13:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    aStack_58.ch = (pRVar7->field_1).ch;
    pvVar8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar8->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    (pRVar7->field_1).pChars = pvVar8;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Chars;
LAB_001387d7:
    paVar14 = &aStack_58;
LAB_0013887f:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar8 = (pRVar7->field_1).pChars;
LAB_0013888d:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar8,&paVar14->ch);
    break;
  case 0x14:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pvVar8 = (pRVar7->field_1).pChars;
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,1);
    paVar14 = &pRVar7->field_1;
    goto LAB_0013888d;
  default:
    pRVar7 = Parse<SGParser::Generator::RegExprDFAParseElement>::operator[](parse,0);
    pRVar7->DataType = Null;
  }
  return bVar15;
}

Assistant:

bool Reduce(Parse<RegExprDFAParseElement>& parse, unsigned productionID) override {
        switch (productionID) {
            // RegExp --> RegExp  A
            case RE_RegExpConcat: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::And};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[1].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // RegExp --> A
            case RE_RegExp:
                break;

                // A --> A '|' B
            case RE_AOr: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Or};
                pnewNode->Add(parse[0].pNode);
                pnewNode->Add(parse[2].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // A --> B
            case RE_A:
                break;

                // B --> B '*'
            case RE_BStar: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Star};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }
                // B --> B '+'
            case RE_BPlus: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Plus};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> B '?'
            case RE_BQuestion: {
                const auto pnewNode = new RegExprDFANode{RegExprDFANode::NodeType::Question};
                pnewNode->Add(parse[0].pNode);

                parse[0].pNode    = pnewNode;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;
                break;
            }

                // B --> C
            case RE_B:
                break;

                // C --> '(' RegExp ')'
            case RE_CParen:
                parse[0].pNode    = parse[1].pNode;
                parse[0].DataType = parse[1].DataType;
                break;

                // C --> character
            case RE_CChar:
                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, parse[0].ch};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;

                // C --> '.'
            case RE_CDot: {
                // Construct a list of all characters but '\n'
                std::vector<unsigned> charList;
                charList.reserve(253u);
                for (unsigned k = 1u; k <= 255u; ++k)
                    if (k != '\n' && k != '\r')
                        charList.push_back(k);

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' GroupSet ']'
            case RE_CGroupSet: {
                const auto pgroupSet = parse[1].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters represented by the groupSet...
                for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                    for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                        charList.push_back(j);

                // Delete std::vector
                parse[1].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '[' '^' GroupSet ']'
            case RE_CNotGroupSet: {
                // Make a NFA out of the sequence
                const auto pgroupSet = parse[2].pChars;
                std::vector<unsigned> charList;

                // Construct a list of all the characters NOT represented by the groupSet...
                // NOTE: Depends on 0..255 ASCII
                for (unsigned k = 1u; k <= 255u; ++k) {
                    bool f = false;
                    for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                        for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                            if (j == k)
                                f = true;

                    if (!f)
                        charList.push_back(k);
                }
                // Delete std::vector
                parse[2].Destroy();

                parse[0].pNode    = new RegExprDFANode{RegExprDFANode::NodeType::Char,
                                                       PositionCount++, charList};
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                Nodes.push_back(parse[0].pNode);
                break;
            }

                // C --> '{' CharSet '}'
            case RE_CCharSet: {
                // Generate a string from the char std::vector
                SG_ASSERT(parse[1].pChars);
                String macroName;
                macroName.reserve(parse[1].pChars->size());
                for (auto const& ord : *parse[1].pChars) {
                    macroName.push_back(char(ord));
                }

                // Delete the character std::vector
                parse[1].Destroy();

                // Try to find it in macro list
                SG_ASSERT(pMacroSyntaxTrees != nullptr);
                auto const& map = *pMacroSyntaxTrees;
                auto const& iter = map.find(macroName);
                if (iter == map.end()) {
                    std::string names;
                    for (auto const& [name, _] : map)
                        names += " '" + name + '\'';
                    pLex->CheckForErrorAndReport("Macro '%s' not defined; there are %zu known macros:%s",
                                                 macroName.data(), map.size(), names.data());
                    // Bad!
                    return false;
                }

                // Invariant: macroName should also be in pLex->Macros:
                SG_ASSERT(pLex != nullptr);
                SG_ASSERT(pLex->Macros.find(macroName) != pLex->Macros.end());

                // Get the macro node from the Macros list
                SG_ASSERT(iter->second);
                auto& macroTree = *iter->second;

                if (!macroTree.pRoot) {
                    pLex->CheckForErrorAndReport("Invalid regular expression in macro '%s' used",
                                                 macroName.data());
                    // Bad!
                    return false;
                }

                // Change all the character positions
                parse[0].pNode    = macroTree.pRoot;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Node;

                // Take care of nodes
                Nodes.insert(Nodes.end(), macroTree.CharNodes.begin(), macroTree.CharNodes.end());

                // clear the temporary tree
                macroTree.pRoot = nullptr;
                break;
            }

            // GroupSet --> character
            case RE_GroupSetChar: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code);
                break;
            }

                // GroupSet --> character GroupSet
            case RE_GroupSetCharGroupSet:
                // Add the char to the end of the CharSet std::vector
                parse[1].pChars->push_back(parse[0].ch);
                parse[0].pChars   = parse[1].pChars;
                parse[0].DataType = parse[1].DataType;
                break;

                // GroupSet --> character '-' character
            case RE_GroupSetCharList: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                parse[0].pChars->push_back(code2);
                break;
            }

                // GroupSet --> character '-' character GroupSet
            case RE_GroupSetCharListGroupSet: {
                // Add the char to the end of the CharSet std::vector
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[3].pChars->push_back(code);
                parse[3].pChars->push_back(code2);
                parse[0].pChars   = parse[3].pChars;
                parse[0].DataType = parse[3].DataType;
                break;
            }

                // CharSet --> character
            case RE_CharSet: {
                // Get the code and add it to the new std::vector
                const auto code   = parse[0].ch;
                // Create a new std::vector of chars
                parse[0].pChars   = new std::vector<unsigned>;
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Chars;
                parse[0].pChars->push_back(code);
                break;
            }

                // CharSet --> CharSet character
            case RE_CharSetChar:
                // Add the char to the end of the CharSet std::vector
                parse[0].pChars->push_back(parse[1].ch);
                break;

            default:
                parse[0].DataType = RegExprDFAParseElement::RegExprDataType::Null;
                break;
        }

        return true;
    }